

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

string * __thiscall
cmGeneratorTarget::GetLinkerTypeProperty
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  string *psVar4;
  long lVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  first2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string propName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string ltype;
  cmList list;
  string local_120;
  string local_100;
  static_string_view *local_e0;
  static_string_view *local_d8;
  static_string_view DL_END;
  static_string_view DL_BEGIN;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  propName._M_dataplus._M_p = (pointer)&propName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&propName,"LINKER_TYPE","");
  psVar4 = (string *)GetProperty(this,&propName);
  if ((psVar4 == (string *)0x0) || (psVar4->_M_string_length == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    goto LAB_0057ff70;
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,propName._M_dataplus._M_p,
             propName._M_dataplus._M_p + propName._M_string_length);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,this,&local_100,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_120,pcVar1,pcVar1 + psVar4->_M_string_length);
  cmGeneratorExpression::Evaluate
            (&ltype,&local_120,this->LocalGenerator,config,this,&dagChecker,this,lang);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if (this->DeviceLink == true) {
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,ltype._M_dataplus._M_p,
               ltype._M_dataplus._M_p + ltype._M_string_length);
    init._M_len = 1;
    init._M_array = &local_178;
    cmList::cmList(&list,init);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    pbVar2 = list.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_178._M_dataplus._M_p = (pointer)&DL_BEGIN;
    DL_BEGIN.super_string_view._M_len = 0xd;
    DL_BEGIN.super_string_view._M_str = "<DEVICE_LINK>";
    local_178._M_string_length = (size_type)&DL_END;
    DL_END.super_string_view._M_len = 0xe;
    DL_END.super_string_view._M_str = "</DEVICE_LINK>";
    lVar5 = (long)list.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)list.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 7;
    _Var6._M_current =
         list.Values.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_e0 = (static_string_view *)local_178._M_dataplus._M_p;
    local_d8 = (static_string_view *)local_178._M_string_length;
    if (0 < lVar5) {
      _Var6._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&((list.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
           ((long)list.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)list.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff80U));
      lVar5 = lVar5 + 1;
      __it._M_current =
           list.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                              *)&local_178,__it);
        __first._M_current = __it._M_current;
        if (bVar3) goto LAB_0057fea7;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                              *)&local_178,__it._M_current + 1);
        __first._M_current = __it._M_current + 1;
        if (bVar3) goto LAB_0057fea7;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                              *)&local_178,__it._M_current + 2);
        __first._M_current = __it._M_current + 2;
        if (bVar3) goto LAB_0057fea7;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                              *)&local_178,__it._M_current + 3);
        __first._M_current = __it._M_current + 3;
        if (bVar3) goto LAB_0057fea7;
        __it._M_current = __it._M_current + 4;
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
    lVar5 = (long)pbVar2 - (long)_Var6._M_current >> 5;
    if (lVar5 == 1) {
LAB_0057fe20:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                            *)&local_178,_Var6);
      __first._M_current = _Var6._M_current;
      if (!bVar3) {
        __first._M_current = pbVar2;
      }
    }
    else if (lVar5 == 2) {
LAB_0057fe0b:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
              ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                            *)&local_178,_Var6);
      __first._M_current = _Var6._M_current;
      if (!bVar3) {
        _Var6._M_current = _Var6._M_current + 1;
        goto LAB_0057fe20;
      }
    }
    else {
      __first._M_current = pbVar2;
      if ((lVar5 == 3) &&
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                  ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                                *)&local_178,_Var6), __first._M_current = _Var6._M_current, !bVar3))
      {
        _Var6._M_current = _Var6._M_current + 1;
        goto LAB_0057fe0b;
      }
    }
LAB_0057fea7:
    _Var6._M_current = __first._M_current + 1;
    if (_Var6._M_current != pbVar2 && __first._M_current != pbVar2) {
      do {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<cmGeneratorTarget::GetLinkerTypeProperty(std::__cxx11::string_const&,std::__cxx11::string_const&)const::__0>
                              *)&local_e0,_Var6);
        if (!bVar3) {
          std::__cxx11::string::operator=((string *)__first._M_current,(string *)_Var6._M_current);
          __first._M_current = __first._M_current + 1;
        }
        _Var6._M_current = _Var6._M_current + 1;
      } while (_Var6._M_current != pbVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&list.Values,(iterator)__first._M_current,
               (iterator)
               list.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    cmList::to_string_abi_cxx11_(__return_storage_ptr__,&list);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&list.Values);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ltype._M_dataplus._M_p == &ltype.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(ltype.field_2._M_allocated_capacity._1_7_,ltype.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = ltype.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = ltype._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(ltype.field_2._M_allocated_capacity._1_7_,ltype.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = ltype._M_string_length;
    ltype._M_string_length = 0;
    ltype.field_2._M_local_buf[0] = '\0';
    ltype._M_dataplus._M_p = (pointer)&ltype.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ltype._M_dataplus._M_p != &ltype.field_2) {
    operator_delete(ltype._M_dataplus._M_p,
                    CONCAT71(ltype.field_2._M_allocated_capacity._1_7_,ltype.field_2._M_local_buf[0]
                            ) + 1);
  }
  if (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&dagChecker.Seen._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
    operator_delete(dagChecker.Property._M_dataplus._M_p,
                    dagChecker.Property.field_2._M_allocated_capacity + 1);
  }
LAB_0057ff70:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)propName._M_dataplus._M_p != &propName.field_2) {
    operator_delete(propName._M_dataplus._M_p,propName.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetLinkerTypeProperty(
  std::string const& lang, std::string const& config) const
{
  std::string propName{ "LINKER_TYPE" };
  auto linkerType = this->GetProperty(propName);
  if (!linkerType.IsEmpty()) {
    cmGeneratorExpressionDAGChecker dagChecker(this, propName, nullptr,
                                               nullptr);
    auto ltype =
      cmGeneratorExpression::Evaluate(*linkerType, this->GetLocalGenerator(),
                                      config, this, &dagChecker, this, lang);
    if (this->IsDeviceLink()) {
      cmList list{ ltype };
      const auto DL_BEGIN = "<DEVICE_LINK>"_s;
      const auto DL_END = "</DEVICE_LINK>"_s;
      cm::erase_if(list, [&](const std::string& item) {
        return item == DL_BEGIN || item == DL_END;
      });
      return list.to_string();
    }
    return ltype;
  }
  return std::string{};
}